

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_manager.cpp
# Opt level: O3

AdbcStatusCode AdbcStatementRelease(AdbcStatement *statement,AdbcError *error)

{
  AdbcStatusCode AVar1;
  
  if (statement->private_driver == (AdbcDriver *)0x0) {
    return '\x06';
  }
  AVar1 = (*statement->private_driver->StatementRelease)(statement,error);
  statement->private_driver = (AdbcDriver *)0x0;
  return AVar1;
}

Assistant:

AdbcStatusCode AdbcStatementRelease(struct AdbcStatement *statement, struct AdbcError *error) {
	if (!statement->private_driver) {
		return ADBC_STATUS_INVALID_STATE;
	}
	INIT_ERROR(error, statement);
	auto status = statement->private_driver->StatementRelease(statement, error);
	statement->private_driver = nullptr;
	return status;
}